

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>_> *fadexpr)

{
  double __x;
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  FadExpr<FadFuncAtan<Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  value_type vVar10;
  double dVar11;
  
  uVar3 = (((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts;
  uVar4 = (((fadexpr->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar4 < (int)uVar3) {
    uVar4 = uVar3;
  }
  uVar3 = (this->dx_).num_elts;
  if (uVar4 != uVar3) {
    if (uVar4 == 0) {
      if (uVar3 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar3 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar4;
      uVar8 = 0xffffffffffffffff;
      if (-1 < (int)uVar4) {
        uVar8 = (long)(int)uVar4 << 3;
      }
      pdVar7 = (double *)operator_new__(uVar8);
      (this->dx_).ptr_to_data = pdVar7;
    }
  }
  if (uVar4 != 0) {
    pdVar7 = (this->dx_).ptr_to_data;
    if (((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.dx_.num_elts == 0) ||
       ((((fadexpr->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar4) {
        uVar8 = 0;
        do {
          vVar10 = FadBinaryMul<FadExpr<FadFuncAtan<Fad<double>_>_>,_Fad<double>_>::dx
                             (&fadexpr->fadexpr_,(int)uVar8);
          pdVar7[uVar8] = vVar10;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
    }
    else if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        pFVar5 = (fadexpr->fadexpr_).left_;
        pFVar6 = (fadexpr->fadexpr_).right_;
        dVar11 = (pFVar5->fadexpr_).expr_.dx_.ptr_to_data[uVar8];
        __x = (pFVar5->fadexpr_).expr_.val_;
        dVar1 = (pFVar6->dx_).ptr_to_data[uVar8];
        dVar2 = pFVar6->val_;
        dVar9 = atan(__x);
        pdVar7[uVar8] = dVar9 * dVar1 + (dVar11 / (__x * __x + 1.0)) * dVar2;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  dVar11 = atan((((fadexpr->fadexpr_).left_)->fadexpr_).expr_.val_);
  this->val_ = dVar11 * ((fadexpr->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}